

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMig.h
# Opt level: O0

int Mig_ObjIsCi(Mig_Obj_t *p)

{
  int iVar1;
  undefined1 local_11;
  Mig_Obj_t *p_local;
  
  iVar1 = Mig_ObjIsTerm(p);
  local_11 = false;
  if (iVar1 != 0) {
    iVar1 = Mig_FanIsNone(p,0);
    local_11 = iVar1 != 0;
  }
  return (int)local_11;
}

Assistant:

static inline int          Mig_ObjIsCi( Mig_Obj_t * p )                        { return Mig_ObjIsTerm(p) &&  Mig_FanIsNone( p, 0 );         }